

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O0

char * llama_print_system_info(void)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  code *pcVar4;
  char *pcVar5;
  ggml_backend_feature *features;
  _func_ggml_backend_feature_ptr_ggml_backend_reg_t *get_features_fn;
  ggml_backend_reg *reg;
  size_t i;
  long *local_20;
  ulong local_8;
  
  if ((llama_print_system_info::s_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&llama_print_system_info::s_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string((string *)&llama_print_system_info::s_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&llama_print_system_info::s_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&llama_print_system_info::s_abi_cxx11_);
  }
  std::__cxx11::string::clear();
  for (local_8 = 0; uVar2 = ggml_backend_reg_count(), local_8 < uVar2; local_8 = local_8 + 1) {
    uVar3 = ggml_backend_reg_get(local_8);
    pcVar4 = (code *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_get_features");
    if (pcVar4 != (code *)0x0) {
      local_20 = (long *)(*pcVar4)(uVar3);
      pcVar5 = (char *)ggml_backend_reg_name(uVar3);
      std::__cxx11::string::operator+=((string *)&llama_print_system_info::s_abi_cxx11_,pcVar5);
      std::__cxx11::string::operator+=((string *)&llama_print_system_info::s_abi_cxx11_," : ");
      for (; *local_20 != 0; local_20 = local_20 + 2) {
        std::__cxx11::string::operator+=
                  ((string *)&llama_print_system_info::s_abi_cxx11_,(char *)*local_20);
        std::__cxx11::string::operator+=((string *)&llama_print_system_info::s_abi_cxx11_," = ");
        std::__cxx11::string::operator+=
                  ((string *)&llama_print_system_info::s_abi_cxx11_,(char *)local_20[1]);
        std::__cxx11::string::operator+=((string *)&llama_print_system_info::s_abi_cxx11_," | ");
      }
    }
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  return pcVar5;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;
    s.clear(); // Clear the string, since it's static, otherwise it will accumulate data from previous calls.

    for (size_t i = 0; i < ggml_backend_reg_count(); i++) {
        auto * reg = ggml_backend_reg_get(i);
        auto * get_features_fn = (ggml_backend_get_features_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_get_features");
        if (get_features_fn) {
            ggml_backend_feature * features = get_features_fn(reg);
            s += ggml_backend_reg_name(reg);
            s += " : ";
            for (; features->name; features++) {
                s += features->name;
                s += " = ";
                s += features->value;
                s += " | ";
            }
        }
    }

    return s.c_str();
}